

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

optional<pbrt::BilinearIntersection>
pbrt::IntersectBilinearPatch
          (Ray *ray,Float tMax,Point3f *p00,Point3f *p10,Point3f *p01,Point3f *p11)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  Point3f *extraout_RDX;
  float *in_R9;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 in_register_00001204 [60];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  optional<pbrt::BilinearIntersection> oVar43;
  undefined1 extraout_var [60];
  
  auVar36._4_60_ = in_register_00001204;
  auVar36._0_4_ = tMax;
  fVar35 = (p01->super_Tuple3<pbrt::Point3,_float>).z;
  fVar38 = (p10->super_Tuple3<pbrt::Point3,_float>).z;
  fVar39 = (p11->super_Tuple3<pbrt::Point3,_float>).y;
  fVar41 = (p01->super_Tuple3<pbrt::Point3,_float>).y;
  fVar42 = (p10->super_Tuple3<pbrt::Point3,_float>).y;
  fVar1 = (p01->super_Tuple3<pbrt::Point3,_float>).x;
  fVar2 = (p10->super_Tuple3<pbrt::Point3,_float>).x;
  fVar3 = (p11->super_Tuple3<pbrt::Point3,_float>).x;
  fVar4 = fVar35 - fVar38;
  fVar5 = fVar39 - in_R9[1];
  auVar17 = ZEXT416((uint)(p11->super_Tuple3<pbrt::Point3,_float>).z);
  auVar13 = vsubss_avx512f(auVar17,ZEXT416((uint)in_R9[2]));
  fVar6 = fVar41 - fVar42;
  fVar7 = fVar1 - fVar2;
  fVar8 = fVar3 - *in_R9;
  auVar14 = vsubss_avx512f(ZEXT416((uint)fVar3),ZEXT416((uint)fVar2));
  auVar15 = vsubss_avx512f(ZEXT416((uint)in_R9[1]),ZEXT416((uint)fVar41));
  auVar16 = vsubss_avx512f(ZEXT416((uint)*in_R9),ZEXT416((uint)fVar1));
  auVar17 = vsubss_avx512f(auVar17,ZEXT416((uint)fVar38));
  auVar18 = vsubss_avx512f(ZEXT416((uint)fVar39),ZEXT416((uint)fVar42));
  auVar19 = vmulss_avx512f(ZEXT416((uint)fVar4),ZEXT416((uint)fVar5));
  auVar20 = vfmsub213ss_avx512f(auVar13,ZEXT416((uint)fVar6),auVar19);
  auVar19 = vfnmadd231ss_avx512f(auVar19,ZEXT416((uint)fVar4),ZEXT416((uint)fVar5));
  auVar22 = ZEXT416((uint)(p00->super_Tuple3<pbrt::Point3,_float>).y);
  auVar21 = vsubss_avx512f(ZEXT416((uint)fVar41),auVar22);
  fVar39 = p00[1].super_Tuple3<pbrt::Point3,_float>.y;
  auVar22 = vsubss_avx512f(ZEXT416((uint)fVar42),auVar22);
  auVar19 = vaddss_avx512f(auVar19,auVar20);
  auVar20 = vmulss_avx512f(ZEXT416((uint)fVar7),auVar13);
  auVar23 = vfmsub213ss_avx512f(ZEXT416((uint)fVar4),ZEXT416((uint)fVar8),auVar20);
  auVar13 = vfnmadd213ss_avx512f(auVar13,ZEXT416((uint)fVar7),auVar20);
  auVar20 = vmulss_avx512f(ZEXT416((uint)fVar6),ZEXT416((uint)fVar8));
  auVar24 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar8),ZEXT416((uint)fVar6),auVar20);
  auVar20 = vfmsub213ss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fVar7),auVar20);
  auVar25 = vsubss_avx512f(ZEXT416((uint)in_R9[2]),ZEXT416((uint)fVar35));
  auVar13 = vaddss_avx512f(auVar23,auVar13);
  auVar26 = ZEXT416((uint)(p00->super_Tuple3<pbrt::Point3,_float>).x);
  auVar23 = vsubss_avx512f(ZEXT416((uint)fVar2),auVar26);
  auVar26 = vsubss_avx512f(ZEXT416((uint)fVar1),auVar26);
  fVar41 = p00[1].super_Tuple3<pbrt::Point3,_float>.x;
  auVar28 = ZEXT416((uint)(p00->super_Tuple3<pbrt::Point3,_float>).z);
  auVar27 = vsubss_avx512f(ZEXT416((uint)fVar38),auVar28);
  auVar28 = vsubss_avx512f(ZEXT416((uint)fVar35),auVar28);
  fVar35 = p00[1].super_Tuple3<pbrt::Point3,_float>.z;
  auVar33 = ZEXT416((uint)fVar39);
  auVar13 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar13._0_4_ * fVar39)),ZEXT416((uint)fVar41),
                                auVar19);
  auVar19 = vmulss_avx512f(auVar27,auVar33);
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar35),
                            ZEXT416((uint)(auVar24._0_4_ + auVar20._0_4_)));
  fVar42 = auVar13._0_4_;
  auVar13 = vfmsub213ss_avx512f(ZEXT416((uint)fVar35),auVar22,auVar19);
  auVar19 = vfnmadd231ss_avx512f(auVar19,auVar27,auVar33);
  auVar34 = ZEXT416((uint)fVar35);
  auVar20 = vmulss_avx512f(auVar26,auVar34);
  auVar24 = vmulss_avx512f(auVar23,auVar34);
  auVar29 = vfmsub213ss_avx512f(ZEXT416((uint)fVar41),auVar27,auVar24);
  auVar24 = vfnmadd231ss_avx512f(auVar24,auVar23,auVar34);
  auVar32 = ZEXT416((uint)fVar41);
  auVar30 = vmulss_avx512f(auVar22,auVar32);
  auVar31 = vfmsub213ss_avx512f(auVar33,auVar23,auVar30);
  auVar30 = vfnmadd231ss_avx512f(auVar30,auVar22,auVar32);
  auVar24 = vmulss_avx512f(auVar18,ZEXT416((uint)(auVar29._0_4_ + auVar24._0_4_)));
  auVar29 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar35),auVar26,auVar20);
  auVar13 = vfmadd231ss_avx512f(auVar24,auVar14,ZEXT416((uint)(auVar13._0_4_ + auVar19._0_4_)));
  auVar19 = vmulss_avx512f(auVar28,auVar33);
  auVar24 = vfmsub213ss_avx512f(auVar34,auVar21,auVar19);
  auVar19 = vfnmadd231ss_avx512f(auVar19,auVar28,ZEXT416((uint)fVar39));
  auVar30 = vfmadd231ss_avx512f(auVar13,auVar17,ZEXT416((uint)(auVar31._0_4_ + auVar30._0_4_)));
  auVar13 = vfmsub213ss_avx512f(auVar32,auVar28,auVar20);
  auVar20 = vmulss_avx512f(auVar21,auVar32);
  auVar31 = vfmsub213ss_avx512f(ZEXT416((uint)fVar39),auVar26,auVar20);
  auVar20 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar41),auVar21,auVar20);
  auVar13 = vmulss_avx512f(auVar15,ZEXT416((uint)(auVar13._0_4_ + auVar29._0_4_)));
  auVar13 = vfmadd231ss_avx512f(auVar13,auVar16,ZEXT416((uint)(auVar24._0_4_ + auVar19._0_4_)));
  auVar13 = vfmadd231ss_avx512f(auVar13,auVar25,ZEXT416((uint)(auVar31._0_4_ + auVar20._0_4_)));
  fVar41 = auVar30._0_4_;
  fVar38 = auVar13._0_4_ - (fVar42 + fVar41);
  auVar19 = ZEXT416((uint)(fVar42 * 4.0 * fVar41));
  auVar13 = vfmsub213ss_fma(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38),auVar19);
  fVar39 = auVar13._0_4_;
  auVar13 = vfnmadd213ss_fma(ZEXT416((uint)(fVar42 * 4.0)),auVar30,auVar19);
  fVar35 = auVar13._0_4_ + fVar39;
  if (0.0 <= fVar35) {
    if (fVar35 < 0.0) {
      auVar37._0_4_ = sqrtf(fVar35);
      auVar37._4_60_ = extraout_var;
      auVar13 = auVar37._0_16_;
      auVar26 = ZEXT416(auVar26._0_4_);
      auVar27 = ZEXT416(auVar27._0_4_);
      auVar21 = ZEXT416(auVar21._0_4_);
      auVar22 = ZEXT416(auVar22._0_4_);
      auVar23 = ZEXT416(auVar23._0_4_);
      auVar28 = ZEXT416(auVar28._0_4_);
      auVar17 = ZEXT416(auVar17._0_4_);
      auVar18 = ZEXT416(auVar18._0_4_);
      auVar14 = ZEXT416(auVar14._0_4_);
      auVar16 = ZEXT416(auVar16._0_4_);
      auVar15 = ZEXT416(auVar15._0_4_);
      auVar25 = ZEXT416(auVar25._0_4_);
      p10 = extraout_RDX;
    }
    else {
      auVar13 = vsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
    }
    if ((fVar42 != 0.0) || (NAN(fVar42))) {
      auVar19._8_4_ = 0x7fffffff;
      auVar19._0_8_ = 0x7fffffff7fffffff;
      auVar19._12_4_ = 0x7fffffff;
      auVar13 = vpternlogd_avx512vl(auVar13,ZEXT416((uint)fVar38),auVar19,0xe4);
      fVar35 = (fVar38 + auVar13._0_4_) * -0.5;
      fVar39 = fVar35 / fVar42;
      auVar19 = ZEXT416((uint)fVar39);
      auVar20._0_4_ = fVar41 / fVar35;
      auVar20._4_12_ = auVar30._4_12_;
      auVar13 = auVar20;
      if (auVar20._0_4_ < fVar39) {
        auVar13 = auVar19;
        auVar19 = auVar20;
      }
    }
    else {
      auVar24._8_4_ = 0x80000000;
      auVar24._0_8_ = 0x8000000080000000;
      auVar24._12_4_ = 0x80000000;
      auVar19 = vxorps_avx512vl(auVar30,auVar24);
      auVar13._0_4_ = auVar19._0_4_ / fVar38;
      auVar13._4_12_ = auVar19._4_12_;
      auVar19 = auVar13;
    }
    fVar35 = auVar19._0_4_;
    if ((0.0 <= fVar35) && (fVar35 <= 1.0)) {
      fVar39 = 1.0 - fVar35;
      auVar20 = vmulss_avx512f(auVar26,auVar19);
      auVar24 = vmulss_avx512f(auVar15,auVar19);
      auVar29 = vmulss_avx512f(auVar25,auVar19);
      fVar38 = p00[1].super_Tuple3<pbrt::Point3,_float>.x;
      auVar30 = vmulss_avx512f(auVar16,auVar19);
      auVar31 = vmulss_avx512f(auVar23,ZEXT416((uint)fVar39));
      auVar32 = vmulss_avx512f(auVar22,ZEXT416((uint)fVar39));
      auVar40 = ZEXT416((uint)fVar39);
      auVar33 = vmulss_avx512f(auVar18,auVar40);
      auVar34 = vmulss_avx512f(auVar27,auVar40);
      fVar42 = auVar20._0_4_ + auVar31._0_4_;
      auVar20 = vmulss_avx512f(auVar21,auVar19);
      fVar1 = auVar24._0_4_ + auVar33._0_4_;
      fVar39 = p00[1].super_Tuple3<pbrt::Point3,_float>.z;
      fVar2 = auVar20._0_4_ + auVar32._0_4_;
      auVar20 = vmulss_avx512f(auVar28,auVar19);
      fVar3 = auVar20._0_4_ + auVar34._0_4_;
      auVar20 = vmulss_avx512f(auVar14,auVar40);
      auVar24 = vmulss_avx512f(auVar17,auVar40);
      fVar4 = auVar29._0_4_ + auVar24._0_4_;
      fVar41 = p00[1].super_Tuple3<pbrt::Point3,_float>.y;
      fVar5 = auVar30._0_4_ + auVar20._0_4_;
      auVar24 = ZEXT416((uint)(fVar1 * fVar39));
      auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)fVar41),auVar24);
      auVar33 = ZEXT416((uint)fVar39);
      auVar24 = vfnmadd231ss_fma(auVar24,auVar33,ZEXT416((uint)fVar1));
      fVar39 = auVar20._0_4_ + auVar24._0_4_;
      auVar24 = vmulss_avx512f(ZEXT416((uint)fVar4),ZEXT416((uint)fVar38));
      auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar5),auVar33,auVar24);
      auVar24 = vfnmadd231ss_avx512f(auVar24,ZEXT416((uint)fVar38),ZEXT416((uint)fVar4));
      fVar6 = auVar20._0_4_ + auVar24._0_4_;
      auVar24 = vfmsub213ss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar38),
                                    ZEXT416((uint)(fVar41 * fVar5)));
      auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(fVar41 * fVar5)),ZEXT416((uint)fVar41),
                                 ZEXT416((uint)fVar5));
      fVar7 = auVar20._0_4_ + auVar24._0_4_;
      auVar24 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar7));
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar6)),ZEXT416((uint)fVar39),
                                ZEXT416((uint)fVar39));
      auVar34 = ZEXT416((uint)fVar6);
      auVar29 = vfmsub213ss_avx512f(ZEXT416((uint)fVar3),auVar34,auVar24);
      auVar24 = vfnmadd231ss_avx512f(auVar24,ZEXT416((uint)fVar7),ZEXT416((uint)fVar2));
      auVar30 = ZEXT416((uint)fVar7);
      auVar20 = vfmadd231ss_fma(auVar20,auVar30,auVar30);
      auVar24 = vaddss_avx512f(auVar29,auVar24);
      auVar32 = ZEXT416((uint)fVar39);
      auVar29 = vmulss_avx512f(ZEXT416((uint)fVar3),auVar32);
      auVar30 = vfmsub213ss_avx512f(auVar30,ZEXT416((uint)fVar42),auVar29);
      auVar29 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar3),auVar32,auVar29);
      auVar31 = vmulss_avx512f(ZEXT416((uint)fVar42),auVar34);
      auVar32 = vfmsub213ss_avx512f(ZEXT416((uint)fVar2),auVar32,auVar31);
      auVar31 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar42),auVar34,auVar31);
      fVar39 = auVar30._0_4_ + auVar29._0_4_;
      auVar29 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar1 * fVar39)),auVar24,ZEXT416((uint)fVar5));
      auVar30 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar41 * fVar39)),auVar24,ZEXT416((uint)fVar38));
      auVar31 = ZEXT416((uint)(auVar32._0_4_ + auVar31._0_4_));
      auVar24 = vfmadd231ss_fma(auVar29,auVar31,ZEXT416((uint)fVar4));
      auVar29 = vfmadd231ss_fma(auVar30,auVar31,auVar33);
      fVar39 = auVar29._0_4_ / auVar20._0_4_;
      uVar9 = vcmpss_avx512f(ZEXT816(0),auVar29,6);
      bVar12 = (bool)((byte)uVar9 & 1);
      uVar9 = vcmpss_avx512f(ZEXT816(0),auVar24,5);
      bVar10 = (bool)((byte)uVar9 & 1);
      uVar9 = vcmpss_avx512f(auVar29,auVar20,6);
      bVar11 = (bool)((byte)uVar9 & 1);
      tMax = (Float)((uint)bVar11 * (int)tMax +
                    (uint)!bVar11 *
                    ((uint)bVar10 * (int)tMax +
                    (uint)!bVar10 *
                    ((uint)bVar12 * (int)tMax + (uint)!bVar12 * (int)(auVar24._0_4_ / auVar20._0_4_)
                    )));
    }
    fVar38 = auVar13._0_4_;
    bVar12 = fVar38 < 0.0;
    if ((!bVar12) && (bVar12 = 1.0 < fVar38, !bVar12)) {
      bVar12 = fVar38 < fVar35;
      if ((fVar38 != fVar35) || (NAN(fVar38) || NAN(fVar35))) {
        fVar38 = 1.0 - fVar38;
        auVar20 = vmulss_avx512f(auVar26,auVar13);
        fVar35 = p00[1].super_Tuple3<pbrt::Point3,_float>.z;
        fVar41 = p00[1].super_Tuple3<pbrt::Point3,_float>.y;
        fVar42 = p00[1].super_Tuple3<pbrt::Point3,_float>.x;
        auVar23 = vmulss_avx512f(auVar23,ZEXT416((uint)fVar38));
        auVar22 = vmulss_avx512f(auVar22,ZEXT416((uint)fVar38));
        auVar26 = ZEXT416((uint)fVar38);
        auVar24 = vmulss_avx512f(auVar27,auVar26);
        fVar38 = auVar20._0_4_ + auVar23._0_4_;
        auVar20 = vmulss_avx512f(auVar21,auVar13);
        fVar1 = auVar20._0_4_ + auVar22._0_4_;
        auVar20 = vmulss_avx512f(auVar28,auVar13);
        auVar18 = vmulss_avx512f(auVar18,auVar26);
        fVar2 = auVar20._0_4_ + auVar24._0_4_;
        auVar14 = vmulss_avx512f(auVar14,auVar26);
        auVar17 = vmulss_avx512f(auVar17,auVar26);
        auVar16 = vmulss_avx512f(auVar16,auVar13);
        fVar3 = auVar16._0_4_ + auVar14._0_4_;
        auVar14 = vmulss_avx512f(auVar15,auVar13);
        fVar4 = auVar14._0_4_ + auVar18._0_4_;
        auVar14 = vmulss_avx512f(auVar25,auVar13);
        fVar5 = auVar14._0_4_ + auVar17._0_4_;
        auVar15 = vmulss_avx512f(ZEXT416((uint)fVar4),ZEXT416((uint)fVar35));
        auVar14 = vfmsub213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar41),auVar15);
        auVar15 = vfnmadd231ss_avx512f(auVar15,ZEXT416((uint)fVar35),ZEXT416((uint)fVar4));
        fVar6 = auVar14._0_4_ + auVar15._0_4_;
        auVar14 = ZEXT416((uint)(fVar42 * fVar5));
        auVar15 = vfmsub213ss_avx512f(ZEXT416((uint)fVar3),ZEXT416((uint)fVar35),auVar14);
        auVar21 = ZEXT416((uint)fVar42);
        auVar14 = vfnmadd231ss_fma(auVar14,auVar21,ZEXT416((uint)fVar5));
        auVar16 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar6));
        auVar17 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar6),auVar16);
        fVar42 = auVar15._0_4_ + auVar14._0_4_;
        auVar14 = vfmsub213ss_fma(ZEXT416((uint)fVar4),auVar21,ZEXT416((uint)(fVar41 * fVar3)));
        auVar15 = vfnmadd231ss_fma(ZEXT416((uint)(fVar41 * fVar3)),ZEXT416((uint)fVar41),
                                   ZEXT416((uint)fVar3));
        fVar7 = auVar14._0_4_ + auVar15._0_4_;
        auVar15 = vfmsub213ss_avx512f(ZEXT416((uint)fVar38),ZEXT416((uint)fVar7),auVar16);
        auVar16 = vfmsub213ss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar42),
                                      ZEXT416((uint)(fVar1 * fVar7)));
        auVar14 = vfnmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar7)),ZEXT416((uint)fVar7),
                                   ZEXT416((uint)fVar1));
        auVar15 = vaddss_avx512f(auVar15,auVar17);
        auVar17 = vmulss_avx512f(ZEXT416((uint)fVar38),ZEXT416((uint)fVar42));
        auVar20 = ZEXT416((uint)fVar6);
        auVar18 = vfmsub213ss_avx512f(ZEXT416((uint)fVar1),auVar20,auVar17);
        auVar17 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar38),ZEXT416((uint)fVar42),auVar17);
        auVar16 = vaddss_avx512f(auVar16,auVar14);
        auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * auVar15._0_4_)),auVar16,auVar21);
        auVar17 = ZEXT416((uint)(auVar18._0_4_ + auVar17._0_4_));
        auVar14 = vfmadd231ss_avx512f(auVar14,auVar17,ZEXT416((uint)fVar35));
        fVar35 = auVar14._0_4_;
        bVar12 = fVar35 < 0.0;
        if (!bVar12) {
          auVar14 = vfmadd213ss_fma(auVar20,auVar20,ZEXT416((uint)(fVar42 * fVar42)));
          auVar14 = vfmadd213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),auVar14);
          fVar38 = auVar14._0_4_;
          bVar12 = fVar38 < fVar35;
          if (!bVar12) {
            auVar14 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar16,
                                      ZEXT416((uint)(auVar15._0_4_ * fVar4)));
            auVar14 = vfmadd213ss_fma(ZEXT416((uint)fVar5),auVar17,auVar14);
            fVar41 = auVar14._0_4_ / fVar38;
            bVar12 = tMax < fVar41;
            if ((fVar41 < tMax) && (bVar12 = fVar41 < 0.0, 0.0 < fVar41)) {
              fVar39 = fVar35 / fVar38;
              auVar19 = auVar13;
            }
          }
        }
      }
    }
    auVar13 = vucomiss_avx512f(auVar36._0_16_);
    if (bVar12) {
      *(undefined1 *)&(ray->d).super_Tuple3<pbrt::Vector3,_float>.x = 1;
      (ray->o).super_Tuple3<pbrt::Point3,_float>.x = auVar19._0_4_;
      (ray->o).super_Tuple3<pbrt::Point3,_float>.y = fVar39;
      (ray->o).super_Tuple3<pbrt::Point3,_float>.z = auVar13._0_4_;
      goto LAB_002948e8;
    }
  }
  (ray->o).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (ray->o).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&(ray->o).super_Tuple3<pbrt::Point3,_float>.z = 0;
LAB_002948e8:
  oVar43._8_8_ = p10;
  oVar43.optionalValue._0_8_ = ray;
  return oVar43;
}

Assistant:

PBRT_CPU_GPU inline pstd::optional<BilinearIntersection> IntersectBilinearPatch(
    const Ray &ray, Float tMax, const Point3f &p00, const Point3f &p10,
    const Point3f &p01, const Point3f &p11) {
    // Find quadratic coefficients for distance from ray to $u$ line
    Vector3f qn = Cross(p10 - p00, p01 - p11);
    Vector3f e11 = p11 - p10, e00 = p01 - p00;
    Vector3f q00 = p00 - ray.o, q10 = p10 - ray.o;
    Float a = Dot(qn, ray.d);
    Float c = Dot(Cross(q00, ray.d), e00);
    Float b = Dot(Cross(q10, ray.d), e11) - (a + c);

    // Solve quadratic for bilinear patch intersection
    Float u1, u2;
    if (!Quadratic(a, b, c, &u1, &u2))
        return {};

    Float t = tMax, u, v;
    // Compute $(u,v)$ and ray $t$ corresponding to first quadratic root
    if (0 <= u1 && u1 <= 1) {
        Vector3f pa = Lerp(u1, q00, q10), pb = Lerp(u1, e00, e11);
        Vector3f n = Cross(ray.d, pb);
        Float det = Dot(n, n);
        n = Cross(n, pa);
        Float t1 = Dot(n, pb), v1 = Dot(n, ray.d);
        // Set _u_, _v_, and _t_ if intersection is valid
        if (t1 > 0 && 0 <= v1 && v1 <= det) {
            u = u1;
            v = v1 / det;
            t = t1 / det;
        }
    }

    // Compute $(u,v)$ and ray $t$ corresponding to second quadratic root
    if (0 <= u2 && u2 <= 1 && u2 != u1) {
        Vector3f pa = Lerp(u2, q00, q10), pb = Lerp(u2, e00, e11);
        Vector3f n = Cross(ray.d, pb);
        Float det = Dot(n, n);
        n = Cross(n, pa);
        Float t2 = Dot(n, pb) / det;
        Float v2 = Dot(n, ray.d);
        if (0 <= v2 && v2 <= det && t > t2 && t2 > 0) {
            t = t2;
            u = u2;
            v = v2 / det;
        }
    }

    // TODO: reject hits with sufficiently small t that we're not sure.
    // Check intersection $t$ against _tMax_ and possibly return intersection
    if (t >= tMax)
        return {};
    return BilinearIntersection{{u, v}, t};
}